

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O0

char * parse_zone_name(char *dst,size_t dstlen,char *p,size_t *len)

{
  ushort **ppuVar1;
  long *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  bool bVar2;
  char *local_18;
  char *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_RDX != (char *)0x0) {
    while( true ) {
      bVar2 = false;
      if (*in_RCX != 0) {
        ppuVar1 = __ctype_b_loc();
        bVar2 = ((*ppuVar1)[(int)*local_18] & 0x400) != 0;
      }
      if (!bVar2) break;
      if (1 < in_RSI) {
        *local_8 = *local_18;
        local_8 = local_8 + 1;
      }
      local_18 = local_18 + 1;
      *in_RCX = *in_RCX + -1;
    }
  }
  if (in_RSI != 0) {
    *local_8 = '\0';
  }
  return local_18;
}

Assistant:

static const char *parse_zone_name(char *dst, size_t dstlen,
                                   const char *p, size_t *len)
{
    /* if there's a pointer, scan the string */
    if (p != 0)
    {
        /* skip alphabetics */
        for ( ; *len != 0 && isalpha(*p) ; ++p, --*len)
        {
            /* 
             *   copy to the output if there's room for this character plus a
             *   null terminator 
             */
            if (dstlen > 1)
                *dst++ = *p;
        }
    }

    /* null-terminate the output if there's room */
    if (dstlen > 0)
        *dst = '\0';

    /* return the final pointer */
    return p;
}